

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O0

bool Gudhi::persistence_matrix::operator<
               (Unordered_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                *c1,Unordered_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                    *c2)

{
  bool bVar1;
  reference ppEVar2;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar3;
  bool local_121;
  ID_index local_10c;
  _Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true>
  local_108;
  _Base_ptr local_100;
  undefined1 local_f8;
  ID_index local_ec;
  _Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true>
  local_e8;
  _Base_ptr local_e0;
  undefined1 local_d8;
  ID_index local_cc;
  _Base_ptr local_c8;
  undefined1 local_c0;
  ID_index local_a4;
  _Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true>
  local_a0;
  _Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true>
  local_98;
  undefined1 local_90 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> entries2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> entries1;
  const_iterator it2;
  const_iterator it1;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
  *c2_local;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
  *c1_local;
  
  if (c1 == c2) {
    c1_local._7_1_ = false;
  }
  else {
    it2 = std::
          unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>_>
          ::begin(&c1->column_);
    entries1._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>_>
                 ::begin(&c2->column_);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &entries2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_90
              );
    while( true ) {
      local_98._M_cur =
           (__node_type *)
           std::
           unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>_>
           ::end(&c1->column_);
      bVar1 = std::__detail::operator!=
                        (&it2.
                          super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true>
                         ,&local_98);
      local_121 = false;
      if (bVar1) {
        local_a0._M_cur =
             (__node_type *)
             std::
             unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>_>
             ::end(&c2->column_);
        local_121 = std::__detail::operator!=
                              ((_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true>
                                *)&entries1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               &local_a0);
      }
      if (local_121 == false) break;
      ppEVar2 = std::__detail::
                _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
                ::operator*(&it2);
      local_a4 = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                 ::get_row_index(*ppEVar2);
      pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&entries2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_a4);
      local_c8 = (_Base_ptr)pVar3.first._M_node;
      local_c0 = pVar3.second;
      ppEVar2 = std::__detail::
                _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
                ::operator*((_Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
                             *)&entries1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_cc = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                 ::get_row_index(*ppEVar2);
      pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_90,&local_cc);
      local_e0 = (_Base_ptr)pVar3.first._M_node;
      local_d8 = pVar3.second;
      std::__detail::
      _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
      ::operator++(&it2);
      std::__detail::
      _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
      ::operator++((_Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
                    *)&entries1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    while( true ) {
      local_e8._M_cur =
           (__node_type *)
           std::
           unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>_>
           ::end(&c1->column_);
      bVar1 = std::__detail::operator!=
                        (&it2.
                          super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true>
                         ,&local_e8);
      if (!bVar1) break;
      ppEVar2 = std::__detail::
                _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
                ::operator*(&it2);
      local_ec = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                 ::get_row_index(*ppEVar2);
      pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&entries2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_ec);
      local_100 = (_Base_ptr)pVar3.first._M_node;
      local_f8 = pVar3.second;
      std::__detail::
      _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
      ::operator++(&it2);
    }
    while( true ) {
      local_108._M_cur =
           (__node_type *)
           std::
           unordered_set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>_>
           ::end(&c2->column_);
      bVar1 = std::__detail::operator!=
                        ((_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true>
                          *)&entries1._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_108);
      if (!bVar1) break;
      ppEVar2 = std::__detail::
                _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
                ::operator*((_Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
                             *)&entries1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_10c = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                  ::get_row_index(*ppEVar2);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_90,&local_10c);
      std::__detail::
      _Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
      ::operator++((_Node_const_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_true,_true>
                    *)&entries1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    c1_local._7_1_ =
         std::operator<((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&entries2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )local_90);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_90
              );
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &entries2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return c1_local._7_1_;
}

Assistant:

bool operator<(const Unordered_set_column& c1, const Unordered_set_column& c2) {
    if (&c1 == &c2) return false;

    using ID_index = Unordered_set_column<Master_matrix>::ID_index;
    using Entry_rep =
        typename std::conditional<Master_matrix::Option_list::is_z2,
                                  ID_index,
                                  std::pair<ID_index, unsigned int>
                                 >::type;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    std::set<Entry_rep> entries1, entries2;
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        entries1.insert((*it1)->get_row_index());
        entries2.insert((*it2)->get_row_index());
      } else {
        entries1.emplace((*it1)->get_row_index(), (*it1)->get_element());
        entries2.emplace((*it2)->get_row_index(), (*it2)->get_element());
      }
      ++it1;
      ++it2;
    }
    while (it1 != c1.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        entries1.insert((*it1)->get_row_index());
      } else {
        entries1.emplace((*it1)->get_row_index(), (*it1)->get_element());
      }
      ++it1;
    }
    while (it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        entries2.insert((*it2)->get_row_index());
      } else {
        entries2.emplace((*it2)->get_row_index(), (*it2)->get_element());
      }
      ++it2;
    }
    return entries1 < entries2;
  }